

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QScreen * __thiscall QWidgetPrivate::associatedScreen(QWidgetPrivate *this)

{
  QGraphicsProxyWidget *pQVar1;
  QWindow *pQVar2;
  QScreen *pQVar3;
  
  pQVar1 = nearestGraphicsProxyWidget(*(QWidget **)&this->field_0x8);
  if (pQVar1 == (QGraphicsProxyWidget *)0x0) {
    pQVar2 = windowHandle(this,Closest);
    if (pQVar2 != (QWindow *)0x0) {
      pQVar3 = (QScreen *)QWindow::screen();
      return pQVar3;
    }
  }
  return (QScreen *)0x0;
}

Assistant:

QScreen *QWidgetPrivate::associatedScreen() const
{
#if QT_CONFIG(graphicsview)
    // embedded widgets never have a screen associated, let QWidget::screen fall back to toplevel
    if (nearestGraphicsProxyWidget(q_func()))
        return nullptr;
#endif
    if (auto window = windowHandle(WindowHandleMode::Closest))
        return window->screen();
    return nullptr;
}